

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_delimgetref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,DelimGetRef *ref)

{
  idx_t __val;
  long in_RDX;
  idx_t tbl_idx;
  string internal_name;
  idx_t local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __val = GenerateTableIndex((Binder *)ref);
  local_70 = __val;
  ::std::__cxx11::to_string(&local_68,__val);
  ::std::operator+(&local_48,"__internal_delim_get_ref_",&local_68);
  ::std::__cxx11::string::~string((string *)&local_68);
  BindContext::AddGenericBinding
            ((BindContext *)
             &(ref->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish,__val,&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(in_RDX + 0x68),(vector<duckdb::LogicalType,_true> *)(in_RDX + 0x80));
  make_uniq<duckdb::BoundDelimGetRef,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&>
            ((duckdb *)&local_68,&local_70,(vector<duckdb::LogicalType,_true> *)(in_RDX + 0x80));
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68._M_dataplus._M_p;
  ::std::__cxx11::string::~string((string *)&local_48);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(DelimGetRef &ref) {
	// Have to add bindings
	idx_t tbl_idx = GenerateTableIndex();
	string internal_name = "__internal_delim_get_ref_" + std::to_string(tbl_idx);
	bind_context.AddGenericBinding(tbl_idx, internal_name, ref.internal_aliases, ref.types);

	return make_uniq<BoundDelimGetRef>(tbl_idx, ref.types);
}